

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

int __thiscall
Fl_Menu_Item::insert
          (Fl_Menu_Item *this,int index,char *mytext,int sc,Fl_Callback *cb,void *data,int myflags)

{
  long lVar1;
  int iVar2;
  Fl_Menu_Item *array_00;
  bool bVar3;
  int local_480;
  int local_474;
  int n_1;
  int n;
  char *item;
  int flags1;
  int msize;
  char buf [1024];
  char *q;
  char *p;
  Fl_Menu_Item *m;
  Fl_Menu_Item *array;
  void *data_local;
  Fl_Callback *cb_local;
  int *piStack_20;
  int sc_local;
  char *mytext_local;
  int index_local;
  Fl_Menu_Item *this_local;
  
  if (this == local_array) {
    local_474 = local_array_size;
  }
  else {
    local_474 = size(this);
  }
  item._4_4_ = local_474;
  p = (char *)this;
  m = this;
  piStack_20 = (int *)mytext;
  mytext_local._4_4_ = index;
  while (item._0_4_ = 0, (char)*piStack_20 != '/') {
    if ((char)*piStack_20 == '_') {
      piStack_20 = (int *)((long)piStack_20 + 1);
      item._0_4_ = 0x80;
    }
    buf._1016_8_ = &flags1;
    q = (char *)piStack_20;
    while( true ) {
      bVar3 = false;
      if (*q != '\0') {
        bVar3 = *q != '/';
      }
      if (!bVar3) break;
      if ((*q == '\\') && (q[1] != '\0')) {
        q = q + 1;
      }
      lVar1 = buf._1016_8_ + 1;
      *(char *)buf._1016_8_ = *q;
      buf._1016_8_ = lVar1;
      q = q + 1;
    }
    *(undefined1 *)buf._1016_8_ = 0;
    _n_1 = &flags1;
    if (*q != '/') goto LAB_00202ab0;
    mytext_local._4_4_ = -1;
    piStack_20 = (int *)(q + 1);
    while ((*(long *)p != 0 &&
           (((*(uint *)(p + 0x20) & 0x40) == 0 ||
            (iVar2 = compare((char *)_n_1,*(char **)p), iVar2 != 0))))) {
      p = (char *)next((Fl_Menu_Item *)p,1);
    }
    if (*(long *)p == 0) {
      iVar2 = (int)(((long)p - (long)m) / 0x38);
      array_00 = array_insert(m,item._4_4_,iVar2,(char *)_n_1,(uint)item | 0x40);
      m = array_insert(array_00,item._4_4_ + 1,iVar2 + 1,(char *)0x0,0);
      item._4_4_ = item._4_4_ + 2;
      p = (char *)(m + iVar2);
    }
    p = p + 0x38;
  }
  _n_1 = piStack_20;
LAB_00202ab0:
  while ((*(long *)p != 0 &&
         (((*(uint *)(p + 0x20) & 0x40) != 0 ||
          (iVar2 = compare(*(char **)p,(char *)_n_1), iVar2 != 0))))) {
    p = (char *)next((Fl_Menu_Item *)p,1);
  }
  if (*(long *)p == 0) {
    if (mytext_local._4_4_ == -1) {
      local_480 = (int)(((long)p - (long)m) / 0x38);
    }
    else {
      local_480 = mytext_local._4_4_;
    }
    m = array_insert(m,item._4_4_,local_480,(char *)_n_1,myflags | (uint)item);
    iVar2 = item._4_4_ + 1;
    if ((myflags & 0x40U) != 0) {
      m = array_insert(m,item._4_4_ + 1,local_480 + 1,(char *)0x0,0);
      iVar2 = item._4_4_ + 2;
    }
    item._4_4_ = iVar2;
    p = (char *)(m + local_480);
  }
  *(int *)(p + 8) = sc;
  *(Fl_Callback **)(p + 0x10) = cb;
  *(void **)(p + 0x18) = data;
  *(uint *)(p + 0x20) = myflags | (uint)item;
  if (m == local_array) {
    local_array_size = item._4_4_;
  }
  return (int)(((long)p - (long)m) / 0x38);
}

Assistant:

int Fl_Menu_Item::insert(
  int index,
  const char *mytext,
  int sc,
  Fl_Callback *cb,	
  void *data,
  int myflags
) {
  Fl_Menu_Item *array = this;
  Fl_Menu_Item *m = this;
  const char *p;
  char *q;
  char buf[1024];

  int msize = array==local_array ? local_array_size : array->size();
  int flags1 = 0;
  const char* item;

  // split at slashes to make submenus:
  for (;;) {

    // leading slash makes us assume it is a filename:
    if (*mytext == '/') {item = mytext; break;}

    // leading underscore causes divider line:
    if (*mytext == '_') {mytext++; flags1 = FL_MENU_DIVIDER;}

    // copy to buf, changing \x to x:
    q = buf;
    for (p=mytext; *p && *p != '/'; *q++ = *p++) if (*p=='\\' && p[1]) p++;
    *q = 0;

    item = buf;
    if (*p != '/') break; /* not a menu title */
    index = -1;           /* any submenu specified overrides insert position */
    mytext = p+1;         /* point at item title */

    /* find a matching menu title: */
    for (; m->text; m = m->next())
      if (m->flags&FL_SUBMENU && !compare(item, m->text)) break;

    if (!m->text) { /* create a new menu */
      int n = (index==-1) ? (int) (m-array) : index;
      array = array_insert(array, msize, n, item, FL_SUBMENU|flags1);
      msize++;
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
      m = array+n;
    }
    m++;	/* go into the submenu */
    flags1 = 0;
  }

  /* find a matching menu item: */
  for (; m->text; m = m->next())
    if (!(m->flags&FL_SUBMENU) && !compare(m->text,item)) break;

  if (!m->text) {	/* add a new menu item */
    int n = (index==-1) ? (int) (m-array) : index;
    array = array_insert(array, msize, n, item, myflags|flags1);
    msize++;
    if (myflags & FL_SUBMENU) { // add submenu delimiter
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
    }
    m = array+n;
  }

  /* fill it in */
  m->shortcut_ = sc;
  m->callback_ = cb;
  m->user_data_ = data;
  m->flags = myflags|flags1;

  if (array == local_array) local_array_size = msize;
  return (int) (m-array);
}